

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpop.c
# Opt level: O2

void * mpt_qpop(mpt_queue *queue,size_t len,void *data)

{
  void *__src;
  int *piVar1;
  ulong __n;
  size_t low;
  ulong local_30;
  
  __src = mpt_queue_data(queue,&local_30);
  __n = queue->len - local_30;
  if (__n == 0) {
    if (queue->len < len) {
LAB_001194e2:
      piVar1 = __errno_location();
      *piVar1 = 0x22;
      return (void *)0x0;
    }
  }
  else {
    if (__n < len) {
      if (data == (void *)0x0) {
        piVar1 = __errno_location();
        *piVar1 = 0x16;
        return (void *)0x0;
      }
      len = len - __n;
      if (local_30 < len) goto LAB_001194e2;
      memcpy(data,(void *)((long)queue->base + (queue->max - len)),__n);
      memcpy((void *)((long)data + len),queue->base,__n);
      __src = data;
      goto LAB_00119505;
    }
    __src = (void *)((__n - len) + (long)queue->base);
  }
  if (data != (void *)0x0) {
    memcpy(data,__src,len);
  }
LAB_00119505:
  queue->len = queue->len - len;
  return __src;
}

Assistant:

extern void *mpt_qpop(MPT_STRUCT(queue) *queue, size_t len, void *data)
{
	size_t low, high;
	uint8_t *base;
	
	/* get data contentent/offset at queue end */
	base = mpt_queue_data(queue, &low);
	high = queue->len - low;
	
	/* aligned queue */
	if (!high) {
		if (len > low) {
			errno = ERANGE;
			return 0;
		}
		if (data) {
			memcpy(data, base, len);
		}
	}
	/* data in sparate parts */
	else if (len > high) {
		if (!data) {
			errno = EINVAL;
			return 0;
		}
		len -= high;
		if (len > low) {
			errno = ERANGE;
			return 0;
		}
		base = ((uint8_t *) queue->base) + queue->max - len;
		memcpy(data, base, high);
		memcpy(((uint8_t *) data) + len, queue->base, high);
		
		base = data;
	}
	/* data in high part */
	else {
		high -= len;
		base = ((uint8_t *) queue->base) + high;
		if (data) {
			memcpy(data, base, len);
		}
	}
	queue->len -= len;
	
	return base;
}